

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_done_sending(connectdata *conn,SingleRequest *k)

{
  CURLcode CVar1;
  
  *(byte *)&k->keepon = (byte)k->keepon & 0xfd;
  if (((conn->bits).field_0x6 & 4) != 0) {
    CVar1 = Curl_readrewind(conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_done_sending(struct connectdata *conn,
                           struct SingleRequest *k)
{
  k->keepon &= ~KEEP_SEND; /* we're done writing */

  /* These functions should be moved into the handler struct! */
  Curl_http2_done_sending(conn);
  Curl_quic_done_sending(conn);

  if(conn->bits.rewindaftersend) {
    CURLcode result = Curl_readrewind(conn);
    if(result)
      return result;
  }
  return CURLE_OK;
}